

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_test.cc
# Opt level: O0

void __thiscall
(anonymous_namespace)::CFLPredictHBDTest_DISABLED_PredictHBDSpeedTest_Test::
~CFLPredictHBDTest_DISABLED_PredictHBDSpeedTest_Test
          (CFLPredictHBDTest_DISABLED_PredictHBDSpeedTest_Test *this)

{
  CFLPredictHBDTest_DISABLED_PredictHBDSpeedTest_Test *in_stack_00000010;
  
  anon_unknown.dwarf_15b07f::CFLPredictHBDTest_DISABLED_PredictHBDSpeedTest_Test::
  ~CFLPredictHBDTest_DISABLED_PredictHBDSpeedTest_Test(in_stack_00000010);
  return;
}

Assistant:

TEST_P(CFLPredictHBDTest, DISABLED_PredictHBDSpeedTest) {
  aom_usec_timer ref_timer;
  aom_usec_timer timer;
  const int bd = 12;
  randData(bd);
  aom_usec_timer_start(&ref_timer);
  for (int k = 0; k < NUM_ITERATIONS_SPEED; k++) {
    predict_ref(sub_luma_pels_ref, chroma_pels_ref, CFL_BUF_LINE, alpha_q3, bd);
  }
  aom_usec_timer_mark(&ref_timer);
  int ref_elapsed_time = (int)aom_usec_timer_elapsed(&ref_timer);

  aom_usec_timer_start(&timer);
  for (int k = 0; k < NUM_ITERATIONS_SPEED; k++) {
    predict(sub_luma_pels, chroma_pels, CFL_BUF_LINE, alpha_q3, bd);
  }
  aom_usec_timer_mark(&timer);
  int elapsed_time = (int)aom_usec_timer_elapsed(&timer);
  printSpeed(ref_elapsed_time, elapsed_time, width, height);
  assertFaster(ref_elapsed_time, elapsed_time);
}